

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O2

string * google::XMLText(string *__return_storage_ptr__,string *txt)

{
  ulong uVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)txt);
  while (uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b198d),
        uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,(char *)0x1);
  }
  while (uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b198f),
        uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,(char *)0x1);
  }
  return __return_storage_ptr__;
}

Assistant:

static string XMLText(const string& txt) {
  string ans = txt;
  for (string::size_type pos = 0; (pos = ans.find("&", pos)) != string::npos; )
    ans.replace(pos++, 1, "&amp;");
  for (string::size_type pos = 0; (pos = ans.find("<", pos)) != string::npos; )
    ans.replace(pos++, 1, "&lt;");
  return ans;
}